

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_TIFFPredictor.hh
# Opt level: O1

void __thiscall Pl_TIFFPredictor::~Pl_TIFFPredictor(Pl_TIFFPredictor *this)

{
  pointer puVar1;
  pointer plVar2;
  pointer pcVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  
  (this->super_Pipeline)._vptr_Pipeline = (_func_int **)&PTR__Pl_TIFFPredictor_002ee878;
  puVar1 = (this->out).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1,(long)(this->out).
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar1);
  }
  plVar2 = (this->previous).super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (plVar2 != (pointer)0x0) {
    operator_delete(plVar2,(long)(this->previous).
                                 super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)plVar2);
  }
  puVar1 = (this->cur_row).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
           .super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1,(long)(this->cur_row).
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar1);
  }
  (this->super_Pipeline)._vptr_Pipeline = (_func_int **)&PTR__Pipeline_002edaa0;
  pcVar3 = (this->super_Pipeline).identifier._M_dataplus._M_p;
  paVar4 = &(this->super_Pipeline).identifier.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar4) {
    operator_delete(pcVar3,paVar4->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

~Pl_TIFFPredictor() override = default;